

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception_format_value.cpp
# Opt level: O2

void __thiscall
duckdb::ExceptionFormatValue::ExceptionFormatValue(ExceptionFormatValue *this,int64_t int_val)

{
  this->type = FORMAT_VALUE_TYPE_INTEGER;
  this->dbl_val = 0.0;
  this->int_val = int_val;
  (this->str_val)._M_dataplus._M_p = (pointer)&(this->str_val).field_2;
  (this->str_val)._M_string_length = 0;
  (this->str_val).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

ExceptionFormatValue::ExceptionFormatValue(int64_t int_val)
    : type(ExceptionFormatValueType::FORMAT_VALUE_TYPE_INTEGER), int_val(int_val) {
}